

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractConsumerStage.h
# Opt level: O0

void __thiscall
teetime::
AbstractConsumerStage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
::execute(AbstractConsumerStage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
          *this)

{
  bool bVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>
  *ppVar2;
  undefined1 local_70 [8];
  Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  v;
  AbstractConsumerStage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  *this_local;
  
  v._88_8_ = this;
  if (this->m_inputport ==
      (InputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
       *)0x0) {
    __assert_fail("m_inputport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/../include/teetime/stages/AbstractConsumerStage.h"
                  ,0x41,
                  "virtual void teetime::AbstractConsumerStage<std::pair<std::basic_string<char>, teetime::Image>>::execute() [T = std::pair<std::basic_string<char>, teetime::Image>]"
                 );
  }
  InputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  ::receive((Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
             *)local_70,this->m_inputport);
  bVar1 = Optional::operator_cast_to_bool((Optional *)local_70);
  if (bVar1) {
    ppVar2 = Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
             ::operator*((Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
                          *)local_70);
    (*(this->super_AbstractStage)._vptr_AbstractStage[4])(this,ppVar2);
  }
  else {
    bVar1 = InputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
            ::isClosed(this->m_inputport);
    if (bVar1) {
      AbstractStage::terminate(&this->super_AbstractStage);
    }
    else {
      std::this_thread::yield();
    }
  }
  Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  ::~Optional((Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
               *)local_70);
  return;
}

Assistant:

virtual void execute() override final
    {
      assert(m_inputport);

      //TEETIME_DEBUG() << "'execute' stage";
      auto v = m_inputport->receive();
      if(v)
      {
        execute(std::move(*v));
      }
      else if(m_inputport->isClosed())
      {
        terminate();
      }
      else
      {
        std::this_thread::yield();
      }
    }